

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int editPage(MemPage *pPg,int iOld,int iNew,int nNew,CellArray *pCArray)

{
  byte bVar1;
  u16 uVar2;
  ushort uVar3;
  int iVar4;
  u8 *pBegin;
  u8 *puVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int nCell;
  bool bVar11;
  u8 *pData;
  u8 *local_50;
  ulong local_48;
  u8 *local_40;
  ulong local_38;
  
  local_40 = pPg->aData;
  local_48 = (ulong)pPg->hdrOffset;
  pBegin = pPg->aCellIdx + nNew * 2;
  uVar3 = pPg->nCell;
  uVar9 = (uint)uVar3;
  bVar1 = pPg->nOverflow;
  local_38 = (ulong)(uint)(iOld - iNew);
  uVar8 = uVar9;
  if (iOld < iNew) {
    iVar4 = pageFreeArray(pPg,iOld,iNew - iOld,pCArray);
    uVar8 = (uint)uVar3 - iVar4;
    if ((int)(uint)uVar3 < iVar4) {
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x112e6,
                  "fc82b73eaac8b36950e527f12c4b5dc1e147e6f4ad2217ae43ad82882a88bfa6");
      uVar8 = uVar9;
    }
    else {
      memmove(pPg->aCellIdx,pPg->aCellIdx + iVar4 * 2,(ulong)(uVar9 * 2));
    }
    if ((int)uVar9 < iVar4) {
      return 0xb;
    }
  }
  iVar10 = uVar9 + iOld + (uint)bVar1;
  iVar4 = nNew + iNew;
  nCell = iVar10 - iVar4;
  if (nCell != 0 && iVar4 <= iVar10) {
    iVar4 = pageFreeArray(pPg,iVar4,nCell,pCArray);
    uVar8 = uVar8 - iVar4;
  }
  local_50 = local_40 +
             (ulong)((ushort)(*(ushort *)(local_40 + local_48 + 5) << 8 |
                             *(ushort *)(local_40 + local_48 + 5) >> 8) - 1 & 0xffff) + 1;
  if (pBegin <= local_50) {
    if (iNew < iOld) {
      iVar4 = (int)local_38;
      if (nNew <= (int)local_38) {
        iVar4 = nNew;
      }
      puVar5 = pPg->aCellIdx;
      memmove(puVar5 + iVar4 * 2,puVar5,(long)(int)(uVar8 * 2));
      iVar10 = pageInsertArray(pPg,pBegin,&local_50,puVar5,iNew,iVar4,pCArray);
      if (iVar10 != 0) goto LAB_0017b97f;
      uVar8 = iVar4 + uVar8;
    }
    if (pPg->nOverflow != '\0') {
      uVar7 = 0;
      do {
        iVar10 = (uint)pPg->aiOvfl[uVar7] + iOld;
        iVar4 = iVar10 - iNew;
        bVar11 = true;
        if (iVar4 < nNew && -1 < iVar4) {
          puVar5 = pPg->aCellIdx + (uint)(iVar4 * 2);
          if (uVar8 - iVar4 != 0 && iVar4 <= (int)uVar8) {
            memmove(puVar5 + 2,puVar5,(long)(int)((uVar8 - iVar4) * 2));
          }
          uVar8 = uVar8 + 1;
          iVar4 = pageInsertArray(pPg,pBegin,&local_50,puVar5,iVar10,1,pCArray);
          bVar11 = iVar4 == 0;
        }
        if (!bVar11) goto LAB_0017b97f;
        uVar7 = uVar7 + 1;
      } while (uVar7 < pPg->nOverflow);
    }
    iVar4 = pageInsertArray(pPg,pBegin,&local_50,pPg->aCellIdx + (int)(uVar8 * 2),uVar8 + iNew,
                            nNew - uVar8,pCArray);
    if (iVar4 == 0) {
      pPg->nCell = (u16)nNew;
      pPg->nOverflow = '\0';
      local_40[local_48 + 3] = (u8)((uint)nNew >> 8);
      local_40[local_48 + 4] = (u8)pPg->nCell;
      uVar3 = (ushort)((int)local_50 - (int)local_40);
      *(ushort *)(local_40 + local_48 + 5) = uVar3 << 8 | uVar3 >> 8;
      return 0;
    }
  }
LAB_0017b97f:
  if (0 < nNew) {
    lVar6 = (long)iNew * 2;
    iVar4 = nNew + 1;
    do {
      if (*(short *)((long)pCArray->szCell + lVar6) == 0) {
        uVar2 = (*pCArray->pRef->xCellSize)
                          (pCArray->pRef,*(u8 **)((long)pCArray->apCell + lVar6 * 4));
        *(u16 *)((long)pCArray->szCell + lVar6) = uVar2;
      }
      lVar6 = lVar6 + 2;
      iVar4 = iVar4 + -1;
    } while (1 < iVar4);
  }
  iVar4 = rebuildPage(pCArray,iNew,nNew,pPg);
  return iVar4;
}

Assistant:

static int editPage(
  MemPage *pPg,                   /* Edit this page */
  int iOld,                       /* Index of first cell currently on page */
  int iNew,                       /* Index of new first cell on page */
  int nNew,                       /* Final number of cells on page */
  CellArray *pCArray              /* Array of cells and sizes */
){
  u8 * const aData = pPg->aData;
  const int hdr = pPg->hdrOffset;
  u8 *pBegin = &pPg->aCellIdx[nNew * 2];
  int nCell = pPg->nCell;       /* Cells stored on pPg */
  u8 *pData;
  u8 *pCellptr;
  int i;
  int iOldEnd = iOld + pPg->nCell + pPg->nOverflow;
  int iNewEnd = iNew + nNew;

#ifdef SQLITE_DEBUG
  u8 *pTmp = sqlite3PagerTempSpace(pPg->pBt->pPager);
  memcpy(pTmp, aData, pPg->pBt->usableSize);
#endif

  /* Remove cells from the start and end of the page */
  assert( nCell>=0 );
  if( iOld<iNew ){
    int nShift = pageFreeArray(pPg, iOld, iNew-iOld, pCArray);
    if( nShift>nCell ) return SQLITE_CORRUPT_BKPT;
    memmove(pPg->aCellIdx, &pPg->aCellIdx[nShift*2], nCell*2);
    nCell -= nShift;
  }
  if( iNewEnd < iOldEnd ){
    int nTail = pageFreeArray(pPg, iNewEnd, iOldEnd - iNewEnd, pCArray);
    assert( nCell>=nTail );
    nCell -= nTail;
  }

  pData = &aData[get2byteNotZero(&aData[hdr+5])];
  if( pData<pBegin ) goto editpage_fail;

  /* Add cells to the start of the page */
  if( iNew<iOld ){
    int nAdd = MIN(nNew,iOld-iNew);
    assert( (iOld-iNew)<nNew || nCell==0 || CORRUPT_DB );
    assert( nAdd>=0 );
    pCellptr = pPg->aCellIdx;
    memmove(&pCellptr[nAdd*2], pCellptr, nCell*2);
    if( pageInsertArray(
          pPg, pBegin, &pData, pCellptr,
          iNew, nAdd, pCArray
    ) ) goto editpage_fail;
    nCell += nAdd;
  }

  /* Add any overflow cells */
  for(i=0; i<pPg->nOverflow; i++){
    int iCell = (iOld + pPg->aiOvfl[i]) - iNew;
    if( iCell>=0 && iCell<nNew ){
      pCellptr = &pPg->aCellIdx[iCell * 2];
      if( nCell>iCell ){
        memmove(&pCellptr[2], pCellptr, (nCell - iCell) * 2);
      }
      nCell++;
      if( pageInsertArray(
            pPg, pBegin, &pData, pCellptr,
            iCell+iNew, 1, pCArray
      ) ) goto editpage_fail;
    }
  }

  /* Append cells to the end of the page */
  assert( nCell>=0 );
  pCellptr = &pPg->aCellIdx[nCell*2];
  if( pageInsertArray(
        pPg, pBegin, &pData, pCellptr,
        iNew+nCell, nNew-nCell, pCArray
  ) ) goto editpage_fail;

  pPg->nCell = nNew;
  pPg->nOverflow = 0;

  put2byte(&aData[hdr+3], pPg->nCell);
  put2byte(&aData[hdr+5], pData - aData);

#ifdef SQLITE_DEBUG
  for(i=0; i<nNew && !CORRUPT_DB; i++){
    u8 *pCell = pCArray->apCell[i+iNew];
    int iOff = get2byteAligned(&pPg->aCellIdx[i*2]);
    if( SQLITE_WITHIN(pCell, aData, &aData[pPg->pBt->usableSize]) ){
      pCell = &pTmp[pCell - aData];
    }
    assert( 0==memcmp(pCell, &aData[iOff],
            pCArray->pRef->xCellSize(pCArray->pRef, pCArray->apCell[i+iNew])) );
  }
#endif

  return SQLITE_OK;
 editpage_fail:
  /* Unable to edit this page. Rebuild it from scratch instead. */
  populateCellCache(pCArray, iNew, nNew);
  return rebuildPage(pCArray, iNew, nNew, pPg);
}